

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.c
# Opt level: O0

sexp_conflict
sexp_scheduler(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict root_thread)

{
  sexp_conflict psVar1;
  sexp_mark_stack_ptr_t *psVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  sexp psVar7;
  long lVar8;
  sexp in_RDI;
  bool bVar9;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_conflict tmp;
  sexp_conflict pollfds;
  sexp_conflict front;
  sexp_conflict paused;
  sexp_conflict runner;
  sexp_conflict evt;
  sexp_conflict ls2;
  sexp_conflict ls1;
  sexp_conflict res;
  suseconds_t usecs;
  pollfd *pfds;
  timeval tval;
  int k;
  int i;
  undefined2 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff12;
  undefined1 in_stack_ffffffffffffff13;
  undefined1 in_stack_ffffffffffffff14;
  undefined1 in_stack_ffffffffffffff15;
  undefined1 in_stack_ffffffffffffff16;
  undefined1 in_stack_ffffffffffffff17;
  sexp_sint_t in_stack_ffffffffffffff18;
  sexp_conflict in_stack_ffffffffffffff20;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  sexp_conflict in_stack_ffffffffffffff30;
  sexp_conflict in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  sexp_conflict in_stack_ffffffffffffff48;
  sexp_gc_var_t local_a0;
  sexp_conflict local_90;
  sexp_conflict *local_88;
  sexp_conflict local_80;
  sexp_conflict local_78;
  sexp_conflict local_70;
  sexp local_68;
  sexp_conflict local_60;
  sexp_conflict local_58;
  sexp local_50;
  long local_48;
  sexp_conflict local_40;
  timeval local_38;
  int local_28;
  int local_24;
  sexp local_8;
  
  local_48 = 0;
  local_90 = (sexp)0x43e;
  local_8 = in_RDI;
  memset(&local_a0,0,0x10);
  psVar7 = local_8;
  local_a0.var = &local_90;
  local_a0.next = (local_8->value).context.saves;
  (local_8->value).context.saves = &local_a0;
  local_80 = (sexp_conflict)(((local_8->value).type.setters)->value).context.mark_stack[9].prev;
  local_78 = (sexp_conflict)(((local_8->value).type.setters)->value).context.mark_stack[10].end;
  if ((((local_8->value).type.setters)->value).context.mark_stack[10].prev !=
      (sexp_mark_stack_ptr_t *)0x1) {
    psVar1 = (sexp_conflict)(((local_8->value).type.setters)->value).context.mark_stack[0xb].start;
    local_70 = psVar1;
    if ((((ulong)psVar1 & 3) == 0) && (psVar1->tag == 0x24)) {
      if ((psVar1->value).flonum_bits[0x60a3] != '\0') {
        (psVar1->value).flonum_bits[0x60a3] = '\0';
        sexp_thread_start((sexp_conflict)
                          CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),
                          in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                          (sexp_conflict)
                          CONCAT17(in_stack_ffffffffffffff17,
                                   CONCAT16(in_stack_ffffffffffffff16,
                                            CONCAT15(in_stack_ffffffffffffff15,
                                                     CONCAT14(in_stack_ffffffffffffff14,
                                                              CONCAT13(in_stack_ffffffffffffff13,
                                                                       CONCAT12(
                                                  in_stack_ffffffffffffff12,
                                                  in_stack_ffffffffffffff10)))))));
      }
    }
    else if ((((ulong)psVar1 & 3) == 0) && (psVar1->tag == 0x17)) {
      local_90 = (sexp_conflict)sexp_intern(local_8,"signal-runner",0xffffffffffffffff);
      local_90 = (sexp_conflict)sexp_env_cell(psVar7,psVar1,local_90,0);
      if ((((((ulong)local_90 & 3) == 0) && (local_90->tag == 6)) &&
          (((local_90->value).string.offset & 3) == 0)) &&
         (((local_90->value).type.cpl)->tag == 0x14)) {
        local_70 = sexp_make_thread(in_stack_ffffffffffffff48,
                                    (sexp_conflict)
                                    CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                                    (sexp_sint_t)in_stack_ffffffffffffff38,in_stack_ffffffffffffff30
                                    ,(sexp_conflict)
                                     CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
        (((local_8->value).type.setters)->value).context.mark_stack[0xb].start =
             (sexp_conflict *)local_70;
        sexp_thread_start((sexp_conflict)
                          CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),
                          in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                          (sexp_conflict)
                          CONCAT17(in_stack_ffffffffffffff17,
                                   CONCAT16(in_stack_ffffffffffffff16,
                                            CONCAT15(in_stack_ffffffffffffff15,
                                                     CONCAT14(in_stack_ffffffffffffff14,
                                                              CONCAT13(in_stack_ffffffffffffff13,
                                                                       CONCAT12(
                                                  in_stack_ffffffffffffff12,
                                                  in_stack_ffffffffffffff10)))))));
        if ((((ulong)local_80 & 3) != 0) || (local_80->tag != 6)) {
          local_80 = (sexp_conflict)
                     (((local_8->value).type.setters)->value).context.mark_stack[9].prev;
        }
      }
    }
  }
  local_88 = (((local_8->value).type.setters)->value).context.mark_stack[0xb].end;
  if (((((ulong)local_88 & 3) == 0) &&
      (psVar2 = (((local_8->value).type.setters)->value).context.mark_stack[0xc].prev,
      auVar3._8_8_ = (long)psVar2 >> 0x3f, auVar3._0_8_ = (ulong)psVar2 & 0xfffffffffffffffe,
      (ulong)*(uint *)local_88 == SUB168(auVar3 / SEXT816(2),0))) &&
     (local_88[2] != (sexp_conflict)0x0)) {
    local_40 = local_88[1];
    local_28 = poll((pollfd *)local_88[1],(nfds_t)local_88[2],0);
    local_24 = (int)local_88[2];
    while( true ) {
      local_24 = local_24 + -1;
      in_stack_ffffffffffffff47 = -1 < local_24 && 0 < local_28;
      if (-1 >= local_24 || 0 >= local_28) break;
      if (0 < *(short *)(&local_40->field_0x6 + (long)local_24 * 8)) {
        local_28 = local_28 + -1;
        local_68 = (local_8->value).opcode.dl;
        if (((((ulong)local_68 & 3) == 0) && (local_68->tag == 0x10)) ||
           ((((ulong)local_68 & 3) == 0 && (local_68->tag == 0x11)))) {
          if ((local_68->value).type.getters == (sexp)0x0) {
            if ((((local_68->value).string.length & 3) == 0) &&
               (((local_68->value).type.slots)->tag == 0x12)) {
              in_stack_ffffffffffffff30 = (((local_68->value).type.slots)->value).type.cpl;
              in_stack_ffffffffffffff38 = in_stack_ffffffffffffff30;
            }
            else {
              in_stack_ffffffffffffff30 = (sexp_conflict)0xffffffffffffffff;
              in_stack_ffffffffffffff38 = in_stack_ffffffffffffff30;
            }
          }
          else {
            iVar6 = fileno((FILE *)(local_68->value).type.getters);
            in_stack_ffffffffffffff38 = (sexp_conflict)(long)iVar6;
          }
          if (in_stack_ffffffffffffff38 !=
              (sexp_conflict)(long)(int)(&local_40->tag)[(long)local_24 * 2]) goto LAB_0010429e;
LAB_001042df:
          (local_8->value).flonum_bits[0x60a3] = '\0';
          (local_8->value).flonum_bits[0x60a2] = '\0';
          (local_8->value).opcode.dl = (sexp)0x3e;
        }
        else {
LAB_0010429e:
          if ((((ulong)local_68 & 1) == 1) &&
             (auVar4._8_8_ = (long)local_68 >> 0x3f,
             auVar4._0_8_ = (ulong)local_68 & 0xfffffffffffffffe,
             SUB168(auVar4 / SEXT816(2),0) == (long)(int)(&local_40->tag)[(long)local_24 * 2]))
          goto LAB_001042df;
        }
        local_58 = (sexp_conflict)&DAT_0000023e;
        local_60 = local_78;
        psVar1 = local_60;
        while( true ) {
          local_60 = psVar1;
          bVar9 = false;
          if (((ulong)local_60 & 3) == 0) {
            bVar9 = local_60->tag == 6;
          }
          if (!bVar9) break;
          local_68 = (((local_60->value).type.name)->value).opcode.dl;
          if (((((ulong)local_68 & 3) == 0) && (local_68->tag == 0x10)) ||
             ((((ulong)local_68 & 3) == 0 && (local_68->tag == 0x11)))) {
            if ((local_68->value).type.getters == (sexp)0x0) {
              if ((((local_68->value).string.length & 3) == 0) &&
                 (((local_68->value).type.slots)->tag == 0x12)) {
                psVar7 = (((local_68->value).type.slots)->value).type.cpl;
              }
              else {
                psVar7 = (sexp)0xffffffffffffffff;
              }
            }
            else {
              iVar6 = fileno((FILE *)(local_68->value).type.getters);
              psVar7 = (sexp)(long)iVar6;
            }
            if (psVar7 != (sexp)(long)(int)(&local_40->tag)[(long)local_24 * 2]) goto LAB_0010445d;
LAB_001044a6:
            (((local_60->value).type.name)->value).flonum_bits[0x60a3] = '\0';
            (((local_60->value).type.name)->value).flonum_bits[0x60a2] = '\0';
            (((local_60->value).type.name)->value).opcode.dl = (sexp)0x3e;
            if (local_58 == (sexp_conflict)&DAT_0000023e) {
              local_78 = (local_60->value).type.cpl;
              (((local_8->value).type.setters)->value).context.mark_stack[10].end =
                   (sexp_conflict *)local_78;
            }
            else {
              (local_58->value).type.cpl = (local_60->value).type.cpl;
            }
            local_90 = (local_60->value).type.cpl;
            (local_60->value).string.offset = 0x23e;
            psVar1 = local_90;
            if ((local_60->value).type.name != local_8) {
              if ((((ulong)(((local_8->value).type.setters)->value).context.mark_stack[10].start & 3
                   ) == 0) &&
                 (*(int *)(((local_8->value).type.setters)->value).context.mark_stack[10].start == 6
                 )) {
                (((local_8->value).type.setters)->value).context.mark_stack[10].start[2] = local_60;
              }
              else {
                local_80 = local_60;
                (((local_8->value).type.setters)->value).context.mark_stack[9].prev =
                     (sexp_mark_stack_ptr_t *)local_60;
              }
              (((local_8->value).type.setters)->value).context.mark_stack[10].start =
                   (sexp_conflict *)local_60;
              psVar1 = local_90;
            }
          }
          else {
LAB_0010445d:
            if ((((ulong)local_68 & 1) == 1) &&
               (auVar5._8_8_ = (long)local_68 >> 0x3f,
               auVar5._0_8_ = (ulong)local_68 & 0xfffffffffffffffe,
               SUB168(auVar5 / SEXT816(2),0) == (long)(int)(&local_40->tag)[(long)local_24 * 2]))
            goto LAB_001044a6;
            local_58 = local_60;
            psVar1 = (local_60->value).type.cpl;
          }
        }
        if ((undefined1 *)(long)local_24 < (undefined1 *)((long)&local_88[2][-1].value + 0x60bfU)) {
          *(undefined8 *)(&local_40->tag + (long)local_24 * 2) =
               *(undefined8 *)((long)&local_40[7].value + (long)&local_88[2][-1].value * 8 + 0x6078)
          ;
        }
        local_88[2] = (sexp_conflict)((long)&local_88[2][-1].value + 0x60bf);
      }
    }
  }
  if ((local_8->value).context.refuel < 1) {
    local_58 = (sexp_conflict)&DAT_0000023e;
    local_60 = local_78;
    while( true ) {
      bVar9 = false;
      if (((ulong)local_60 & 3) == 0) {
        bVar9 = local_60->tag == 6;
      }
      if (!bVar9) break;
      if ((((local_60->value).type.name)->value).opcode.dl == local_8) {
        (((local_60->value).type.name)->value).flonum_bits[0x60a3] = '\0';
        (((local_60->value).type.name)->value).flonum_bits[0x60a2] = '\0';
        if (local_58 == (sexp_conflict)&DAT_0000023e) {
          local_78 = (local_60->value).type.cpl;
          (((local_8->value).type.setters)->value).context.mark_stack[10].end =
               (sexp_conflict *)local_78;
        }
        else {
          (local_58->value).type.cpl = (local_60->value).type.cpl;
        }
        local_90 = (local_60->value).type.cpl;
        (local_60->value).string.offset = 0x23e;
        if ((((ulong)(((local_8->value).type.setters)->value).context.mark_stack[10].start & 3) == 0
            ) && (*(int *)(((local_8->value).type.setters)->value).context.mark_stack[10].start == 6
                 )) {
          (((local_8->value).type.setters)->value).context.mark_stack[10].start[2] = local_60;
        }
        else {
          local_80 = local_60;
          (((local_8->value).type.setters)->value).context.mark_stack[9].prev =
               (sexp_mark_stack_ptr_t *)local_60;
        }
        (((local_8->value).type.setters)->value).context.mark_stack[10].start =
             (sexp_conflict *)local_60;
        local_60 = local_90;
      }
      else {
        local_58 = local_60;
        local_60 = (local_60->value).type.cpl;
      }
    }
  }
  if (((((ulong)local_78 & 3) == 0) && (local_78->tag == 6)) &&
     (iVar6 = gettimeofday(&local_38,(__timezone_ptr_t)0x0), iVar6 == 0)) {
    local_58 = (sexp_conflict)&DAT_0000023e;
    local_60 = local_78;
    while( true ) {
      bVar9 = false;
      if ((((((ulong)local_60 & 3) == 0) && (bVar9 = false, local_60->tag == 6)) &&
          (((((local_60->value).type.name)->value).context.tval.tv_sec != 0 ||
           (bVar9 = false, (((local_60->value).type.name)->value).context.tval.tv_usec != 0)))) &&
         ((bVar9 = true,
          local_38.tv_sec <= (((local_60->value).type.name)->value).context.tval.tv_sec &&
          (bVar9 = false,
          (((local_60->value).type.name)->value).context.tval.tv_sec == local_38.tv_sec)))) {
        bVar9 = (((local_60->value).type.name)->value).context.tval.tv_usec < local_38.tv_usec;
      }
      if (!bVar9) break;
      (((local_60->value).type.name)->value).flonum_bits[0x60a2] = '\x01';
      (((local_60->value).type.name)->value).flonum_bits[0x60a3] = '\0';
      local_58 = local_60;
      local_60 = (local_60->value).type.cpl;
    }
    if ((((ulong)local_58 & 3) == 0) && (local_58->tag == 6)) {
      (local_58->value).string.offset = 0x23e;
      if ((((ulong)(((local_8->value).type.setters)->value).context.mark_stack[10].start & 3) == 0)
         && (*(int *)(((local_8->value).type.setters)->value).context.mark_stack[10].start == 6)) {
        (((local_8->value).type.setters)->value).context.mark_stack[10].start[2] = local_78;
      }
      else {
        local_80 = local_78;
        (((local_8->value).type.setters)->value).context.mark_stack[9].prev =
             (sexp_mark_stack_ptr_t *)local_78;
      }
      (((local_8->value).type.setters)->value).context.mark_stack[10].start =
           (sexp_conflict *)local_58;
      local_78 = local_60;
      (((local_8->value).type.setters)->value).context.mark_stack[10].end =
           (sexp_conflict *)local_60;
    }
  }
  if ((((ulong)local_80 & 3) == 0) && (local_80->tag == 6)) {
    local_50 = (local_80->value).type.name;
    if (((local_8->value).context.refuel < 1) || ((local_8->value).flonum_bits[0x60a3] != '\0')) {
      (((local_8->value).type.setters)->value).context.mark_stack[9].prev =
           (sexp_mark_stack_ptr_t *)(local_80->value).type.cpl;
      if ((((local_80->value).string.offset & 3) != 0) || (((local_80->value).type.cpl)->tag != 6))
      {
        (((local_8->value).type.setters)->value).context.mark_stack[10].start =
             (sexp_conflict *)0x23e;
      }
      if ((0 < (local_8->value).context.refuel) &&
         (lVar8 = sexp_memq_op(local_8,0,2,local_8,local_78), lVar8 == 0x3e)) {
        sexp_insert_timed((sexp_conflict)
                          CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                          in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
      }
      local_78 = (sexp_conflict)(((local_8->value).type.setters)->value).context.mark_stack[10].end;
    }
    else {
      ((((local_8->value).type.setters)->value).context.mark_stack[9].prev)->end =
           (sexp_conflict *)local_8;
      (((local_8->value).type.setters)->value).context.mark_stack[10].start[2] =
           (sexp_conflict)(((local_8->value).type.setters)->value).context.mark_stack[9].prev;
      (((local_8->value).type.setters)->value).context.mark_stack[9].prev =
           ((((local_8->value).type.setters)->value).context.mark_stack[9].prev)->prev;
      (((local_8->value).type.setters)->value).context.mark_stack[10].start =
           (sexp_conflict *)(((local_8->value).type.setters)->value).context.mark_stack[10].start[2]
      ;
      (((local_8->value).type.setters)->value).context.mark_stack[10].start[2] =
           (sexp_conflict)0x23e;
    }
  }
  else {
    local_50 = local_8;
    if ((local_8->value).context.refuel < 1) {
      local_58 = local_78;
      while( true ) {
        bVar9 = false;
        if (((ulong)local_58 & 3) == 0) {
          bVar9 = local_58->tag == 6;
        }
        if (!bVar9) goto LAB_00104e14;
        local_68 = (((local_58->value).type.name)->value).opcode.dl;
        if (((((ulong)local_68 & 1) == 1) ||
            ((((ulong)local_68 & 3) == 0 && (local_68->tag == 0x10)))) ||
           ((((ulong)local_68 & 3) == 0 && (local_68->tag == 0x11)))) break;
        local_58 = (local_58->value).type.cpl;
      }
      local_50 = (local_58->value).type.name;
    }
  }
LAB_00104e14:
  psVar7 = local_50;
  if ((local_50->value).flonum_bits[0x60a3] != '\0') {
    if ((((((ulong)local_78 & 3) == 0) && (local_78->tag == 6)) &&
        (((((local_78->value).type.name)->value).context.tval.tv_sec != 0 ||
         ((((local_78->value).type.name)->value).context.tval.tv_usec != 0)))) &&
       (((((local_78->value).type.name)->value).context.tval.tv_sec <
         (local_50->value).context.tval.tv_sec ||
        (((((local_78->value).type.name)->value).context.tval.tv_sec ==
          (local_50->value).context.tval.tv_sec &&
         ((((local_78->value).type.name)->value).context.tval.tv_usec <
          (local_50->value).context.tval.tv_usec)))))) {
      local_90 = local_50;
      local_50 = (local_78->value).type.name;
      local_78 = (local_78->value).type.cpl;
      (((local_8->value).type.setters)->value).context.mark_stack[10].end =
           (sexp_conflict *)local_78;
      lVar8 = sexp_memq_op(local_8,0,2,psVar7,local_78);
      if (lVar8 == 0x3e) {
        sexp_insert_timed((sexp_conflict)
                          CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                          in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
      }
    }
    else {
      sexp_delete_list(local_8,0x2c,local_50);
    }
    local_78 = (sexp_conflict)(((local_8->value).type.setters)->value).context.mark_stack[10].end;
    local_48 = 0;
    if (((local_50->value).context.tval.tv_sec == 0) &&
       ((local_50->value).context.tval.tv_usec == 0)) {
      local_48 = 10000;
    }
    else {
      gettimeofday(&local_38,(__timezone_ptr_t)0x0);
      if ((local_38.tv_sec <= (local_50->value).context.tval.tv_sec) &&
         ((local_48 = ((local_50->value).context.tval.tv_sec - local_38.tv_sec) * 1000000,
          local_38.tv_usec < (local_50->value).context.tval.tv_usec || (0 < local_48)))) {
        local_48 = ((local_50->value).context.tval.tv_usec - local_38.tv_usec) + local_48;
      }
      if (local_48 < 0x2711) {
        (local_50->value).flonum_bits[0x60a3] = '\0';
        (local_50->value).flonum_bits[0x60a2] = '\x01';
      }
      else {
        local_48 = 10000;
      }
    }
    usleep((__useconds_t)local_48);
  }
  (local_8->value).context.saves = local_a0.next;
  return local_50;
}

Assistant:

sexp sexp_scheduler (sexp ctx, sexp self, sexp_sint_t n, sexp root_thread) {
  int i, k;
  struct timeval tval;
  struct pollfd *pfds;
  suseconds_t usecs = 0;
  sexp res, ls1, ls2, evt, runner, paused, front, pollfds;
  sexp_gc_var1(tmp);
  sexp_gc_preserve1(ctx, tmp);

  front  = sexp_global(ctx, SEXP_G_THREADS_FRONT);
  paused = sexp_global(ctx, SEXP_G_THREADS_PAUSED);

  /* check signals */
  if (sexp_global(ctx, SEXP_G_THREADS_SIGNALS) != SEXP_ZERO) {
    runner = sexp_global(ctx, SEXP_G_THREADS_SIGNAL_RUNNER);
    if (! sexp_contextp(runner)) { /* ensure the runner exists */
      if (sexp_envp(runner)) {
        tmp = sexp_env_cell(ctx, runner, (tmp=sexp_intern(ctx, "signal-runner", -1)), 0);
        if (sexp_pairp(tmp) && sexp_procedurep(sexp_cdr(tmp))) {
          runner = sexp_make_thread(ctx, self, 2, sexp_cdr(tmp), SEXP_FALSE);
          sexp_global(ctx, SEXP_G_THREADS_SIGNAL_RUNNER) = runner;
          sexp_thread_start(ctx, self, 1, runner);
          if (!sexp_pairp(front))
            front = sexp_global(ctx, SEXP_G_THREADS_FRONT);
        }
      }
    } else if (sexp_context_waitp(runner)) { /* wake it if it's sleeping */
      sexp_context_waitp(runner) = 0;
      sexp_thread_start(ctx, self, 1, runner);
    }
  }

  /* check blocked fds */
  pollfds = sexp_global(ctx, SEXP_G_THREADS_POLL_FDS);
  if (sexp_pollfdsp(ctx, pollfds) && sexp_pollfds_num_fds(pollfds) > 0) {
    pfds = sexp_pollfds_fds(pollfds);
    k = poll(sexp_pollfds_fds(pollfds), sexp_pollfds_num_fds(pollfds), 0);
    for (i=sexp_pollfds_num_fds(pollfds)-1; i>=0 && k>0; --i) {
      if (pfds[i].revents > 0) { /* free all threads blocked on this fd */
        k--;
        /* maybe unblock the current thread */
        evt = sexp_context_event(ctx);
        if ((sexp_portp(evt) && (sexp_port_fileno(evt) == pfds[i].fd))
            || (sexp_fixnump(evt) && (sexp_unbox_fixnum(evt) == pfds[i].fd))) {
          sexp_context_waitp(ctx) = 0;
          sexp_context_timeoutp(ctx) = 0;
          sexp_context_event(ctx) = SEXP_FALSE;
        }
        /* maybe unblock paused threads */
        for (ls1=SEXP_NULL, ls2=paused; sexp_pairp(ls2); ) {
          /* TODO: distinguish input and output on the same fd? */
          evt = sexp_context_event(sexp_car(ls2));
          if ((sexp_portp(evt) && sexp_port_fileno(evt) == pfds[i].fd)
              || (sexp_fixnump(evt) && sexp_unbox_fixnum(evt) == pfds[i].fd)) {
            sexp_context_waitp(sexp_car(ls2)) = 0;
            sexp_context_timeoutp(sexp_car(ls2)) = 0;
            sexp_context_event(sexp_car(ls2)) = SEXP_FALSE;
            if (ls1==SEXP_NULL)
              sexp_global(ctx, SEXP_G_THREADS_PAUSED) = paused = sexp_cdr(ls2);
            else
              sexp_cdr(ls1) = sexp_cdr(ls2);
            tmp = sexp_cdr(ls2);
            sexp_cdr(ls2) = SEXP_NULL;
            if (sexp_car(ls2) != ctx) {
              if (! sexp_pairp(sexp_global(ctx, SEXP_G_THREADS_BACK))) {
                sexp_global(ctx, SEXP_G_THREADS_FRONT) = front = ls2;
              } else {
                sexp_cdr(sexp_global(ctx, SEXP_G_THREADS_BACK)) = ls2;
              }
              sexp_global(ctx, SEXP_G_THREADS_BACK) = ls2;
            }
            ls2 = tmp;
          } else {
            ls1 = ls2;
            ls2 = sexp_cdr(ls2);
          }
        }
        if (i < (sexp_pollfds_num_fds(pollfds) - 1)) {
          pfds[i] = pfds[sexp_pollfds_num_fds(pollfds) - 1];
        }
        sexp_pollfds_num_fds(pollfds) -= 1;
      }
    }
  }

  /* if we've terminated, check threads joining us */
  if (sexp_context_refuel(ctx) <= 0) {
    for (ls1=SEXP_NULL, ls2=paused; sexp_pairp(ls2); ) {
      if (sexp_context_event(sexp_car(ls2)) == ctx) {
        sexp_context_waitp(sexp_car(ls2)) = 0;
        sexp_context_timeoutp(sexp_car(ls2)) = 0;
        if (ls1==SEXP_NULL)
          sexp_global(ctx, SEXP_G_THREADS_PAUSED) = paused = sexp_cdr(ls2);
        else
          sexp_cdr(ls1) = sexp_cdr(ls2);
        tmp = sexp_cdr(ls2);
        sexp_cdr(ls2) = SEXP_NULL;
        if (! sexp_pairp(sexp_global(ctx, SEXP_G_THREADS_BACK))) {
          sexp_global(ctx, SEXP_G_THREADS_FRONT) = front = ls2;
        } else {
          sexp_cdr(sexp_global(ctx, SEXP_G_THREADS_BACK)) = ls2;
        }
        sexp_global(ctx, SEXP_G_THREADS_BACK) = ls2;
        ls2 = tmp;
      } else {
        ls1 = ls2;
        ls2 = sexp_cdr(ls2);
      }
    }
  }

  /* check timeouts */
  if (sexp_pairp(paused)) {
    if (gettimeofday(&tval, NULL) == 0) {
      ls1 = SEXP_NULL;
      ls2 = paused;
      while (sexp_pairp(ls2) && sexp_context_before(sexp_car(ls2), tval)) {
        sexp_context_timeoutp(sexp_car(ls2)) = 1;
        sexp_context_waitp(sexp_car(ls2)) = 0;
        ls1 = ls2;
        ls2 = sexp_cdr(ls2);
      }
      if (sexp_pairp(ls1)) {
        sexp_cdr(ls1) = SEXP_NULL;
        if (! sexp_pairp(sexp_global(ctx, SEXP_G_THREADS_BACK))) {
          sexp_global(ctx, SEXP_G_THREADS_FRONT) = front = paused;
        } else {
          sexp_cdr(sexp_global(ctx, SEXP_G_THREADS_BACK)) = paused;
        }
        sexp_global(ctx, SEXP_G_THREADS_BACK) = ls1;
        sexp_global(ctx, SEXP_G_THREADS_PAUSED) = paused = ls2;
      }
    }
  }

  /* dequeue next thread */
  if (sexp_pairp(front)) {
    res = sexp_car(front);
    if ((sexp_context_refuel(ctx) <= 0) || sexp_context_waitp(ctx)) {
      /* orig ctx is either terminated or paused */
      sexp_global(ctx, SEXP_G_THREADS_FRONT) = sexp_cdr(front);
      if (! sexp_pairp(sexp_cdr(front)))
        sexp_global(ctx, SEXP_G_THREADS_BACK) = SEXP_NULL;
      if (sexp_context_refuel(ctx) > 0 && sexp_not(sexp_memq(ctx, ctx, paused)))
        sexp_insert_timed(ctx, ctx, SEXP_FALSE);
      paused = sexp_global(ctx, SEXP_G_THREADS_PAUSED);
    } else {
      /* swap with front of queue */
      sexp_car(sexp_global(ctx, SEXP_G_THREADS_FRONT)) = ctx;
      /* rotate front of queue to back */
      sexp_cdr(sexp_global(ctx, SEXP_G_THREADS_BACK))
        = sexp_global(ctx, SEXP_G_THREADS_FRONT);
      sexp_global(ctx, SEXP_G_THREADS_FRONT)
        = sexp_cdr(sexp_global(ctx, SEXP_G_THREADS_FRONT));
      sexp_global(ctx, SEXP_G_THREADS_BACK)
        = sexp_cdr(sexp_global(ctx, SEXP_G_THREADS_BACK));
      sexp_cdr(sexp_global(ctx, SEXP_G_THREADS_BACK)) = SEXP_NULL;
    }
  } else {
    /* no threads to dequeue */
    res = ctx;
    /* prefer a thread we can wait on instead of spinning */
    if (sexp_context_refuel(ctx) <= 0) {
      for (ls1=paused; sexp_pairp(ls1); ls1=sexp_cdr(ls1)) {
        evt = sexp_context_event(sexp_car(ls1));
        if (sexp_fixnump(evt) || sexp_portp(evt)) {
          res = sexp_car(ls1);
          break;
        }
      }
    }
  }

  if (sexp_context_waitp(res)) {
    /* the only thread available was waiting */
    /* TODO: if another thread is blocked on I/O, wait on that with
     * the appropriate minimum timeout */
    if (sexp_pairp(paused)
        && sexp_context_before(sexp_car(paused), sexp_context_timeval(res))) {
      tmp = res;
      res = sexp_car(paused);
      paused = sexp_global(ctx, SEXP_G_THREADS_PAUSED) = sexp_cdr(paused);
      if (sexp_not(sexp_memq(ctx, tmp, paused)))
        sexp_insert_timed(ctx, tmp, tmp);
    } else {
      sexp_delete_list(ctx, SEXP_G_THREADS_PAUSED, res);
    }
    paused = sexp_global(ctx, SEXP_G_THREADS_PAUSED);
    usecs = 0;
    if ((sexp_context_timeval(res).tv_sec == 0)
        && (sexp_context_timeval(res).tv_usec == 0)) {
      /* no timeout, wait for default 10ms */
      usecs = 10*1000;
    } else {
      /* wait until the next timeout, or at most 10ms */
      gettimeofday(&tval, NULL);
      if (tval.tv_sec <= sexp_context_timeval(res).tv_sec) {
        usecs = (sexp_context_timeval(res).tv_sec - tval.tv_sec) * 1000000;
        if (tval.tv_usec < sexp_context_timeval(res).tv_usec || usecs > 0)
          usecs += sexp_context_timeval(res).tv_usec - tval.tv_usec;
      }
      if (usecs > 10*1000) {
        usecs = 10*1000;
      } else {
        sexp_context_waitp(res) = 0;
        sexp_context_timeoutp(res) = 1;
      }
    }
    /* take a nap to avoid busy looping */
    usleep(usecs);
  }

  sexp_gc_release1(ctx);
  return res;
}